

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void print_results_at_current_iteration(double time_elapsed_at_iteration,uint global_iteration)

{
  uint global_iteration_local;
  double time_elapsed_at_iteration_local;
  
  printf("\rFinished iteration %u in %.1lf seconds.\n",time_elapsed_at_iteration,
         (ulong)(global_iteration + 1));
  return;
}

Assistant:

void print_results_at_current_iteration (
    double const time_elapsed_at_iteration,
    unsigned global_iteration) {

// mitya's magic work  
#ifdef ALTERNATIVE_OUTPUT
  printf ("\r" FANCY_OK "Iteration %u finished in %.1lf seconds.\n",
#else
  printf ("\rFinished iteration %u in %.1lf seconds.\n",
#endif /* ALTERNATIVE_OUTPUT */
          global_iteration + 1,
          time_elapsed_at_iteration);

  return;
}